

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

RAMBlock *
qemu_ram_alloc_from_ptr_sparc(uc_struct_conflict8 *uc,ram_addr_t size,void *host,MemoryRegion *mr)

{
  anon_struct_8_1_e05e5bab_for_blocks *paVar1;
  uc_struct *uc_00;
  RAMBlock *pRVar2;
  ulong uVar3;
  RAMBlock **ppRVar4;
  ram_addr_t rVar5;
  ram_addr_t result;
  RAMBlock *mem;
  ram_addr_t rVar6;
  uint8_t *puVar7;
  RAMBlock *pRVar8;
  ulong uVar9;
  anon_struct_16_2_6a822a49_for_next *paVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (host == (void *)0x0) {
    size = -uc->qemu_host_page_size & (size + uc->qemu_host_page_size) - 1;
  }
  mem = (RAMBlock *)g_malloc0(0x48);
  if (mem == (RAMBlock *)0x0) {
    return (RAMBlock *)0x0;
  }
  mem->mr = mr;
  mem->used_length = size;
  mem->max_length = size;
  mem->page_size = uc->qemu_real_host_page_size;
  mem->host = (uint8_t *)host;
  if (host != (void *)0x0) {
    *(byte *)&mem->flags = (byte)mem->flags | 1;
  }
  uc->invalid_addr = 0;
  if (size == 0) {
    __assert_fail("size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x3d6,"ram_addr_t find_ram_offset(struct uc_struct *, ram_addr_t)");
  }
  uc_00 = (uc_struct *)mr->uc;
  paVar1 = &(uc_00->ram_list).blocks;
  pRVar8 = (uc_00->ram_list).blocks.lh_first;
  if (pRVar8 == (RAMBlock *)0x0) {
    rVar6 = 0;
  }
  else if ((uc_00->ram_list).freed == false) {
    rVar6 = 0;
    while (pRVar8 != (RAMBlock *)0x0) {
      uVar9 = pRVar8->max_length + pRVar8->offset;
      pRVar8 = (pRVar8->next).le_next;
      if (rVar6 < uVar9) {
        rVar6 = uVar9;
      }
    }
  }
  else {
    rVar5 = 0xffffffffffffffff;
    rVar6 = rVar5;
    uVar9 = rVar5;
    for (; pRVar8 != (RAMBlock *)0x0; pRVar8 = (pRVar8->next).le_next) {
      uVar11 = pRVar8->offset + pRVar8->max_length + 0x3ffff & 0xfffffffffffc0000;
      uVar12 = rVar5;
      paVar10 = (anon_struct_16_2_6a822a49_for_next *)paVar1;
      while (pRVar2 = paVar10->le_next, pRVar2 != (RAMBlock *)0x0) {
        uVar3 = pRVar2->offset;
        uVar13 = uVar3;
        if (uVar12 < uVar3) {
          uVar13 = uVar12;
        }
        if (uVar11 <= uVar3) {
          uVar12 = uVar13;
        }
        paVar10 = &pRVar2->next;
      }
      uVar12 = uVar12 - uVar11;
      if (size <= uVar12 && uVar12 < uVar9) {
        uVar9 = uVar12;
        rVar6 = uVar11;
      }
    }
    if (rVar6 == 0xffffffffffffffff) {
      fprintf(_stderr,"Failed to find gap of requested size: %lu\n",size);
      abort();
    }
  }
  mem->offset = rVar6;
  if (host == (void *)0x0) {
    puVar7 = (uint8_t *)qemu_anon_ram_alloc(uc_00,size,&mr->align);
    mem->host = puVar7;
    if (puVar7 == (uint8_t *)0x0) {
      uc_00->invalid_error = 1;
      goto LAB_008a24e1;
    }
  }
  pRVar8 = (RAMBlock *)0x0;
  paVar10 = (anon_struct_16_2_6a822a49_for_next *)paVar1;
  while (pRVar2 = paVar10->le_next, pRVar2 != (RAMBlock *)0x0) {
    if (pRVar2->max_length < mem->max_length) {
      ppRVar4 = (pRVar2->next).le_prev;
      (mem->next).le_prev = ppRVar4;
      (mem->next).le_next = pRVar2;
      *ppRVar4 = mem;
      (pRVar2->next).le_prev = &(mem->next).le_next;
      goto LAB_008a24d9;
    }
    pRVar8 = pRVar2;
    paVar10 = &pRVar2->next;
  }
  if (pRVar8 == (RAMBlock *)0x0) {
    (mem->next).le_prev = &paVar1->lh_first;
    (mem->next).le_next = paVar1->lh_first;
    paVar1->lh_first = mem;
  }
  else {
    (mem->next).le_next = (pRVar8->next).le_next;
    (mem->next).le_prev = &(pRVar8->next).le_next;
    (pRVar8->next).le_next = mem;
  }
  pRVar8 = (mem->next).le_next;
  if (pRVar8 != (RAMBlock *)0x0) {
    (pRVar8->next).le_prev = &(mem->next).le_next;
  }
LAB_008a24d9:
  (uc_00->ram_list).mru_block = (RAMBlock *)0x0;
LAB_008a24e1:
  if (uc->invalid_error != 0) {
    g_free(mem);
    return (RAMBlock *)0x0;
  }
  return mem;
}

Assistant:

RAMBlock *qemu_ram_alloc_from_ptr(struct uc_struct *uc, ram_addr_t size, void *host,
                                   MemoryRegion *mr)
{
    RAMBlock *new_block;
    ram_addr_t max_size = size;

    // Don't resize pre-alloced memory as they are given by users.
    if (!host) {
        size = HOST_PAGE_ALIGN(uc, size);
        max_size = HOST_PAGE_ALIGN(uc, max_size);
    }

    new_block = g_malloc0(sizeof(*new_block));
    if (new_block == NULL)
        return NULL;
    new_block->mr = mr;
    new_block->used_length = size;
    new_block->max_length = max_size;
    assert(max_size >= size);
    new_block->page_size = uc->qemu_real_host_page_size;
    new_block->host = host;
    if (host) {
        new_block->flags |= RAM_PREALLOC;
    }

    uc->invalid_addr = UC_ERR_OK;
    ram_block_add(mr->uc, new_block);

    if (uc->invalid_error != UC_ERR_OK) {
        g_free(new_block);
        return NULL;
    }

    return new_block;
}